

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall pstore::logger::log(logger *this,double __x)

{
  char *in_RCX;
  char *in_RDX;
  uint in_ESI;
  double dVar1;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  czstring part2_local;
  czstring part1_local;
  logger *plStack_10;
  priority p_local;
  logger *this_local;
  
  local_28 = in_RCX;
  plStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,in_RDX,&local_69);
  std::operator+(&local_48,&local_68,local_28);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  dVar1 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const part1, gsl::czstring const part2) {
            this->log (p, std::string{part1} + part2);
        }